

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactor.cpp
# Opt level: O2

void __thiscall HFactor::luClear(HFactor *this)

{
  pointer piVar1;
  pointer pdVar2;
  int local_10 [2];
  
  piVar1 = (this->l_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->l_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish != piVar1) {
    (this->l_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar1;
  }
  local_10[1] = 0;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(&this->l_start,local_10 + 1);
  piVar1 = (this->l_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->l_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish != piVar1) {
    (this->l_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar1;
  }
  pdVar2 = (this->l_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->l_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar2) {
    (this->l_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = pdVar2;
  }
  piVar1 = (this->u_pivot_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->u_pivot_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar1) {
    (this->u_pivot_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar1;
  }
  pdVar2 = (this->u_pivot_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->u_pivot_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar2) {
    (this->u_pivot_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = pdVar2;
  }
  piVar1 = (this->u_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->u_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish != piVar1) {
    (this->u_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar1;
  }
  local_10[0] = 0;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(&this->u_start,local_10);
  piVar1 = (this->u_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->u_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish != piVar1) {
    (this->u_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar1;
  }
  pdVar2 = (this->u_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->u_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar2) {
    (this->u_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = pdVar2;
  }
  return;
}

Assistant:

void HFactor::luClear() {
  l_start.clear();
  l_start.push_back(0);
  l_index.clear();
  l_value.clear();

  u_pivot_index.clear();
  u_pivot_value.clear();
  u_start.clear();
  u_start.push_back(0);
  u_index.clear();
  u_value.clear();
}